

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalBGValueFunctionBGCGWrapper.h
# Opt level: O2

void __thiscall LocalBGValueFunctionBGCGWrapper::Print(LocalBGValueFunctionBGCGWrapper *this)

{
  ostream *poVar1;
  string asStack_28 [32];
  
  (*(this->super_LocalBGValueFunctionInterface)._vptr_LocalBGValueFunctionInterface[7])
            (asStack_28,this);
  poVar1 = std::operator<<((ostream *)&std::cout,asStack_28);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_28);
  return;
}

Assistant:

void Print() const { std::cout << SoftPrint() << std::endl; }